

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O0

void qlist_donext(t_qlist *x,int drop,int automatic)

{
  int iVar1;
  int iVar2;
  t_atom *ptVar3;
  bool bVar4;
  float fVar5;
  double dVar6;
  t_atom *local_50;
  t_atom *ap2;
  t_atom *ap;
  t_atom *argv;
  int local_30;
  int wasrewound;
  int onset2;
  int onset;
  int count;
  int argc;
  t_pd *target;
  int automatic_local;
  int drop_local;
  t_qlist *x_local;
  
  _count = (_class **)0x0;
  if (x->x_innext == 0) {
    x->x_innext = 1;
LAB_001d471c:
    iVar1 = binbuf_getnatom((x->x_textbuf).b_binbuf);
    iVar2 = x->x_onset;
    ptVar3 = binbuf_getvec((x->x_textbuf).b_binbuf);
    ap2 = ptVar3 + iVar2;
    while( true ) {
      if (iVar1 <= iVar2) {
        x->x_onset = 0x7fffffff;
        x->x_whenclockset = 0.0;
        x->x_innext = 0;
        outlet_bang(x->x_bangout);
        return;
      }
      bVar4 = true;
      if (ap2->a_type != A_SEMI) {
        bVar4 = ap2->a_type == A_COMMA;
      }
      if (!bVar4) break;
      if (ap2->a_type == A_SEMI) {
        _count = (_class **)0x0;
      }
      iVar2 = iVar2 + 1;
      ap2 = ap2 + 1;
    }
    local_50 = ap2;
    local_30 = iVar2;
    if ((_count != (_class **)0x0) || (ap2->a_type != A_FLOAT)) {
      do {
        local_30 = local_30 + 1;
        local_50 = local_50 + 1;
        bVar4 = false;
        if ((local_30 < iVar1) && (bVar4 = true, local_50->a_type != A_FLOAT)) {
          bVar4 = local_50->a_type == A_SYMBOL;
        }
      } while (bVar4);
      x->x_onset = local_30;
      onset2 = local_30 - iVar2;
      if (_count == (_class **)0x0) goto code_r0x001d4920;
      goto LAB_001d499d;
    }
    do {
      local_30 = local_30 + 1;
      local_50 = local_50 + 1;
      bVar4 = false;
      if (local_30 < iVar1) {
        bVar4 = local_50->a_type == A_FLOAT;
      }
    } while (bVar4);
    x->x_onset = local_30;
    if (automatic == 0) {
      outlet_list((x->x_textbuf).b_ob.te_outlet,(t_symbol *)0x0,local_30 - iVar2,ap2);
    }
    else {
      fVar5 = (ap2->a_w).w_float * x->x_tempo;
      x->x_clockdelay = fVar5;
      clock_delay(x->x_clock,(double)fVar5);
      dVar6 = clock_getsystime();
      x->x_whenclockset = dVar6;
    }
    x->x_innext = 0;
  }
  else {
    pd_error(x,"qlist sent \'next\' from within itself");
  }
  return;
code_r0x001d4920:
  if (ap2->a_type == A_SYMBOL) {
    _count = ((ap2->a_w).w_symbol)->s_thing;
    if (_count == (_class **)0x0) {
      pd_error(x,"qlist: %s: no such object",((ap2->a_w).w_symbol)->s_name);
    }
    else {
      ap2 = ap2 + 1;
      onset2 = onset2 + -1;
      if (onset2 == 0) {
        x->x_onset = local_30;
      }
      else {
LAB_001d499d:
        iVar2 = x->x_rewound;
        x->x_rewound = 0;
        if (drop == 0) {
          if (ap2->a_type == A_FLOAT) {
            pd_typedmess(_count,&s_list,onset2,ap2);
          }
          else if (ap2->a_type == A_SYMBOL) {
            pd_typedmess(_count,(ap2->a_w).w_symbol,onset2 + -1,ap2 + 1);
          }
        }
        if (x->x_rewound != 0) {
          x->x_innext = 0;
          return;
        }
        x->x_rewound = iVar2;
      }
    }
  }
  goto LAB_001d471c;
}

Assistant:

static void qlist_donext(t_qlist *x, int drop, int automatic)
{
    t_pd *target = 0;
    if (x->x_innext)
    {
        pd_error(x, "qlist sent 'next' from within itself");
        return;
    }
    x->x_innext = 1;
    while (1)
    {
        int argc = binbuf_getnatom(x->x_binbuf),
            count, onset = x->x_onset, onset2, wasrewound;
        t_atom *argv = binbuf_getvec(x->x_binbuf);
        t_atom *ap = argv + onset, *ap2;
        if (onset >= argc) goto end;
        while (ap->a_type == A_SEMI || ap->a_type == A_COMMA)
        {
            if (ap->a_type == A_SEMI) target = 0;
            onset++, ap++;
            if (onset >= argc) goto end;
        }

        if (!target && ap->a_type == A_FLOAT)
        {
            ap2 = ap + 1;
            onset2 = onset + 1;
            while (onset2 < argc && ap2->a_type == A_FLOAT)
                onset2++, ap2++;
            x->x_onset = onset2;
            if (automatic)
            {
                clock_delay(x->x_clock,
                    x->x_clockdelay = ap->a_w.w_float * x->x_tempo);
                x->x_whenclockset = clock_getsystime();
            }
            else outlet_list(x->x_ob.ob_outlet, 0, onset2-onset, ap);
            x->x_innext = 0;
            return;
        }
        ap2 = ap + 1;
        onset2 = onset + 1;
        while (onset2 < argc &&
            (ap2->a_type == A_FLOAT || ap2->a_type == A_SYMBOL))
                onset2++, ap2++;
        x->x_onset = onset2;
        count = onset2 - onset;
        if (!target)
        {
            if (ap->a_type != A_SYMBOL) continue;
            else if (!(target = ap->a_w.w_symbol->s_thing))
            {
                pd_error(x, "qlist: %s: no such object",
                    ap->a_w.w_symbol->s_name);
                continue;
            }
            ap++;
            onset++;
            count--;
            if (!count)
            {
                x->x_onset = onset2;
                continue;
            }
        }
        wasrewound = x->x_rewound;
        x->x_rewound = 0;
        if (!drop)
        {
            if (ap->a_type == A_FLOAT)
                typedmess(target, &s_list, count, ap);
            else if (ap->a_type == A_SYMBOL)
                typedmess(target, ap->a_w.w_symbol, count-1, ap+1);
        }
        if (x->x_rewound)
        {
            x->x_innext = 0;
            return;
        }
        x->x_rewound = wasrewound;
    }  /* while (1); never falls through */

end:
    x->x_onset = 0x7fffffff;
    x->x_whenclockset = 0;
    x->x_innext = 0;
    outlet_bang(x->x_bangout);
}